

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::DescriptiveFramework::DescriptiveFramework(DescriptiveFramework *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  DescriptiveFramework *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__DescriptiveFramework_0033ae18;
  optional_property<Kumu::UUID>::optional_property(&this->LinkedDescriptiveFrameworkPlugInId);
  if ((this->super_InterchangeObject).m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_InterchangeObject).m_Dict,MDD_DescriptiveFramework);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_InterchangeObject).super_KLVPacket.m_UL,&local_48);
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xbd1,"ASDCP::MXF::DescriptiveFramework::DescriptiveFramework(const Dictionary *)")
  ;
}

Assistant:

DescriptiveFramework::DescriptiveFramework(const Dictionary* d) : InterchangeObject(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_DescriptiveFramework);
}